

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<vec<Propagator_*>_>::~vec(vec<vec<Propagator_*>_> *this)

{
  uint *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < *in_RDI; uVar1 = uVar1 + 1) {
    vec<Propagator_*>::~vec((vec<Propagator_*> *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
  }
  if (*(long *)(in_RDI + 2) != 0) {
    free(*(void **)(in_RDI + 2));
  }
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}